

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O0

size_t adios2::helper::LinearIndexWithEnd(Dims *start,Dims *end,Dims *point,bool isRowMajor)

{
  byte in_CL;
  Dims *in_stack_00000008;
  size_t linearIndex;
  anon_class_1_0_00000001 lf_ColumnMajor;
  undefined7 in_stack_00000018;
  anon_class_1_0_00000001 lf_RowMajor;
  undefined8 local_28;
  
  if ((in_CL & 1) == 0) {
    local_28 = LinearIndexWithEnd::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)point,
                          (Dims *)CONCAT17(isRowMajor,in_stack_00000018),(Dims *)linearIndex,
                          in_stack_00000008);
  }
  else {
    local_28 = LinearIndexWithEnd::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)point,
                          (Dims *)CONCAT17(isRowMajor,in_stack_00000018),(Dims *)linearIndex,
                          in_stack_00000008);
  }
  return local_28;
}

Assistant:

size_t LinearIndexWithEnd(const Dims &start, const Dims &end, const Dims &point,
                          const bool isRowMajor) noexcept
{
    auto lf_RowMajor = [](const Dims &start, const Dims &end, const Dims &point) -> size_t {
        auto sit = start.rbegin();
        auto eit = end.rbegin();
        auto pit = point.rbegin();
        size_t linearIndex = 0;
        size_t product = 1;
        for (; pit != point.rend(); ++pit)
        {
            linearIndex += (*pit - *sit) * product;
            // count = end - start + 1;
            product *= (*eit - *sit + 1);
            ++sit;
            ++eit;
        }
        return linearIndex;
    };

    auto lf_ColumnMajor = [](const Dims &start, const Dims &end, const Dims &point) -> size_t {
        auto sit = start.begin();
        auto eit = end.begin();
        auto pit = point.begin();
        size_t linearIndex = 0;
        size_t product = 1;
        for (; pit != point.end(); ++pit)
        {
            linearIndex += (*pit - *sit) * product;
            // count = end - start + 1;
            product *= (*eit - *sit + 1);
            ++sit;
            ++eit;
        }
        return linearIndex;
    };

    size_t linearIndex = MaxSizeT - 1;

    if (isRowMajor)
    {
        linearIndex = lf_RowMajor(start, end, point);
    }
    else
    {
        linearIndex = lf_ColumnMajor(start, end, point);
    }

    return linearIndex;
}